

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphEdit.cpp
# Opt level: O1

void __thiscall GraphEdit::GraphEdit(GraphEdit *this,GraphModel *model,QWidget *parent)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  void **ppvVar5;
  undefined4 *puVar6;
  int iVar7;
  code *local_50;
  undefined8 local_48;
  QObject local_40 [8];
  QObject local_38 [8];
  code *local_30;
  ImplFn local_28;
  
  QAbstractScrollArea::QAbstractScrollArea(&this->super_QAbstractScrollArea,parent);
  *(undefined ***)this = &PTR_metaObject_001fe1d0;
  *(undefined ***)&this->field_0x10 = &PTR__GraphEdit_001fe3a8;
  this->mModel = model;
  this->mMode = WaveformView;
  (this->mPlotRect).x1 = 0;
  (this->mPlotRect).y1 = 0;
  (this->mPlotRect).x2 = -1;
  (this->mPlotRect).y2 = -1;
  this->mBarMode = false;
  this->mLines = true;
  (this->mMouseOver).super__Optional_base<QPoint,_true,_true>._M_payload.
  super__Optional_payload_base<QPoint>._M_engaged = false;
  (this->mLastMouseCoords).xp = 0;
  (this->mLastMouseCoords).yp = 0;
  (this->mBackgroundColor).cspec = Invalid;
  this->mMinValue = 0;
  this->mMaxValue = 0;
  this->mCellWidth = 0;
  this->mCellHeight = 0;
  this->mAlternateInterval = 0;
  (this->mBackgroundColor).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this->mBackgroundColor).ct + 2) = 0;
  (this->mAlternateColor).cspec = Invalid;
  (this->mAlternateColor).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this->mAlternateColor).ct + 2) = 0;
  (this->mLineColor).cspec = Invalid;
  (this->mLineColor).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this->mLineColor).ct + 2) = 0;
  (this->mSampleColor).cspec = Invalid;
  (this->mSampleColor).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this->mSampleColor).ct + 2) = 0;
  ppvVar5 = (void **)QAbstractScrollArea::viewport();
  QWidget::setAttribute((WidgetAttribute)ppvVar5,true);
  pvVar4 = ppvVar5[4];
  iVar2 = *(int *)((long)pvVar4 + 0x20);
  iVar7 = *(int *)((long)pvVar4 + 0x1c) - *(int *)((long)pvVar4 + 0x14);
  iVar3 = *(int *)((long)pvVar4 + 0x18);
  (this->mPlotRect).x1 = 0;
  (this->mPlotRect).y1 = 0;
  (this->mPlotRect).x2 = iVar7;
  (this->mPlotRect).y2 = iVar2 - iVar3;
  (this->mPlotRect).x1 = 8;
  piVar1 = &(this->mPlotRect).y1;
  *piVar1 = *piVar1 + 8;
  (this->mPlotRect).x2 = iVar7 + -8;
  piVar1 = &(this->mPlotRect).y2;
  *piVar1 = *piVar1 + -8;
  local_50 = GraphModel::dataChanged;
  local_48 = 0;
  local_30 = QWidget::update;
  local_28 = (ImplFn)0x0;
  puVar6 = (undefined4 *)operator_new(0x20);
  *puVar6 = 1;
  *(code **)(puVar6 + 2) =
       QtPrivate::QSlotObject<void_(QWidget::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar6 + 4) = QWidget::update;
  *(undefined8 *)(puVar6 + 6) = 0;
  QObject::connectImpl
            (local_38,(void **)model,(QObject *)&local_50,ppvVar5,(QSlotObjectBase *)&local_30,
             (ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  local_50 = GraphModel::countChanged;
  local_48 = 0;
  puVar6 = (undefined4 *)operator_new(0x18);
  *puVar6 = 1;
  *(code **)(puVar6 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/src/widgets/GraphEdit.cpp:96:9),_1,_QtPrivate::List<int>,_void>
       ::impl;
  *(GraphEdit **)(puVar6 + 4) = this;
  QObject::connectImpl
            (local_40,(void **)model,(QObject *)&local_50,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  calculateAxis(this);
  setViewModeImpl(this,this->mMode);
  return;
}

Assistant:

GraphEdit::GraphEdit(GraphModel &model, QWidget *parent) :
    QAbstractScrollArea(parent),
    mModel(model),
    mMode(GraphEdit::WaveformView),
    mBarMode(false),
    mLines(true),
    mMinValue(0),
    mMaxValue(0),
    mCellWidth(0),
    mCellHeight(0),
    mAlternateInterval(0),
    mMouseOver()
{
    auto _viewport = viewport();
    _viewport->setMouseTracking(true);
    mPlotRect = _viewport->rect();
    mPlotRect.adjust(TU::PADDING_X, TU::PADDING_Y, -TU::PADDING_X, -TU::PADDING_Y);

    connect(&model, &GraphModel::dataChanged, _viewport, qOverload<>(&QWidget::update));
    connect(&model, &GraphModel::countChanged, this,
        [this](int count) {
            Q_UNUSED(count)
            calculateCellWidth();
            viewport()->update();
        });

    calculateAxis();
    setViewModeImpl(mMode);
}